

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O0

int __thiscall DIS::DetonationPdu::getMarshalledSize(DetonationPdu *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  const_reference pvVar10;
  undefined1 local_38 [8];
  ArticulationParameter listElement;
  unsigned_long_long idx;
  int marshalSize;
  DetonationPdu *this_local;
  
  iVar2 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_munitionID);
  iVar4 = EventID::getMarshalledSize(&this->_eventID);
  iVar5 = Vector3Float::getMarshalledSize(&this->_velocity);
  iVar6 = Vector3Double::getMarshalledSize(&this->_locationInWorldCoordinates);
  iVar7 = BurstDescriptor::getMarshalledSize(&this->_burstDescriptor);
  iVar8 = Vector3Float::getMarshalledSize(&this->_locationInEntityCoordinates);
  idx._4_4_ = iVar2 + iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + 4;
  listElement._parameterValue = 0.0;
  while( true ) {
    dVar1 = listElement._parameterValue;
    dVar9 = (double)std::
                    vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                    ::size(&this->_articulationParameters);
    if ((ulong)dVar9 <= (ulong)dVar1) break;
    pvVar10 = std::vector<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>::
              operator[](&this->_articulationParameters,(size_type)listElement._parameterValue);
    ArticulationParameter::ArticulationParameter((ArticulationParameter *)local_38,pvVar10);
    iVar2 = ArticulationParameter::getMarshalledSize((ArticulationParameter *)local_38);
    idx._4_4_ = idx._4_4_ + iVar2;
    ArticulationParameter::~ArticulationParameter((ArticulationParameter *)local_38);
    listElement._parameterValue = (double)((long)listElement._parameterValue + 1);
  }
  return idx._4_4_;
}

Assistant:

int DetonationPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _munitionID.getMarshalledSize();  // _munitionID
   marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + _locationInWorldCoordinates.getMarshalledSize();  // _locationInWorldCoordinates
   marshalSize = marshalSize + _burstDescriptor.getMarshalledSize();  // _burstDescriptor
   marshalSize = marshalSize + _locationInEntityCoordinates.getMarshalledSize();  // _locationInEntityCoordinates
   marshalSize = marshalSize + 1;  // _detonationResult
   marshalSize = marshalSize + 1;  // _numberOfArticulationParameters
   marshalSize = marshalSize + 2;  // _pad

   for(unsigned long long idx=0; idx < _articulationParameters.size(); idx++)
   {
        ArticulationParameter listElement = _articulationParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}